

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1d_api.c
# Opt level: O0

MPP_RET av1d_prepare(void *ctx,MppPacket pkt,HalDecTask *task)

{
  RK_U32 RVar1;
  RK_U8 *pRVar2;
  size_t sVar3;
  uint local_88;
  RK_U32 need_split;
  RK_U8 *pos;
  RK_S32 consumed;
  RK_S32 out_size;
  RK_U8 *out_data;
  RK_U8 *pRStack_60;
  RK_S32 length;
  RK_U8 *buf;
  RK_S64 dts;
  RK_S64 pts;
  AV1Context *s;
  Av1CodecContext *av1_ctx;
  HalDecTask *pHStack_30;
  MPP_RET ret;
  HalDecTask *task_local;
  MppPacket pkt_local;
  void *ctx_local;
  
  av1_ctx._4_4_ = 0;
  pts = *ctx;
  dts = -1;
  buf = (RK_U8 *)0xffffffffffffffff;
  pRStack_60 = (RK_U8 *)0x0;
  out_data._4_4_ = 0;
  _consumed = (RK_U8 *)0x0;
  pos._4_4_ = -1;
  pos._0_4_ = 0;
  task->valid = 0;
  *(undefined4 *)((long)ctx + 0xce4) = 0;
  s = (AV1Context *)ctx;
  pHStack_30 = task;
  task_local = (HalDecTask *)pkt;
  pkt_local = ctx;
  dts = mpp_packet_get_pts(pkt);
  buf = (RK_U8 *)mpp_packet_get_dts(task_local);
  pRVar2 = (RK_U8 *)mpp_packet_get_pos(task_local);
  pRStack_60 = pRVar2;
  sVar3 = mpp_packet_get_length(task_local);
  out_data._4_4_ = (uint)sVar3;
  RVar1 = mpp_packet_get_flag(task_local);
  if ((RVar1 & 2) == 0) {
    pos._0_4_ = av1d_split_frame((Av1CodecContext *)s,(RK_U8 **)&consumed,(RK_S32 *)((long)&pos + 4)
                                 ,pRStack_60,out_data._4_4_);
    local_88 = (uint)pos;
    if ((int)(uint)pos < 0) {
      local_88 = out_data._4_4_;
    }
    mpp_packet_set_pos(task_local,pRVar2 + (int)local_88);
    mpp_packet_set_length(task_local,(long)(int)(out_data._4_4_ - (uint)pos));
    sVar3 = mpp_packet_get_length(task_local);
    if (sVar3 == 0) {
      RVar1 = mpp_packet_get_eos(task_local);
      s->ref[4].gm_params[1].wmmat[1] = RVar1;
    }
    if ((av1d_debug & 8) != 0) {
      _mpp_log_l(4,"av1d_api","pkt_len=%d, pts=%lld , out_size %d consumed %d new frame %d eos %d\n"
                 ,"av1d_prepare",(ulong)out_data._4_4_,dts,pos._4_4_,(uint)pos,
                 s->ref[4].gm_params[0].beta,s->ref[4].gm_params[1].wmmat[1]);
    }
    if (pos._4_4_ < 1) {
      pHStack_30->valid = 0;
      if (s->ref[4].gm_params[1].wmmat[1] != 0) {
        pHStack_30->input_packet = (s->gb).buf;
      }
    }
    else {
      av1d_get_frame_stream((Av1CodecContext *)s,pRStack_60,(uint)pos);
      pHStack_30->input_packet = (s->gb).buf;
      mpp_packet_set_pts((s->gb).buf,dts);
      mpp_packet_set_dts((s->gb).buf,(RK_S64)buf);
    }
    if ((s->ref[4].gm_params[1].wmmat[1] != 0) &&
       (sVar3 = mpp_packet_get_length(task_local), sVar3 == 0)) {
      (pHStack_30->flags).val =
           (pHStack_30->flags).val & 0xfffffffffffffffe |
           (ulong)(uint)s->ref[4].gm_params[1].wmmat[1] & 1;
    }
    if ((s->ref[4].gm_params[0].beta != 0) || (((pHStack_30->flags).val & 1) != 0)) {
      if (s->ref[4].gm_params[1].wmmat[0] != 0) {
        pHStack_30->valid = 1;
      }
      s->ref[4].gm_params[1].wmmat[0] = 0;
    }
    ctx_local._4_4_ = MPP_OK;
  }
  else {
    *(undefined4 *)(pts + 0x1bd4) = 0;
    pHStack_30 = (HalDecTask *)0x0;
    *(RK_U8 **)(pts + 0x70) = pRStack_60;
    *(long *)(pts + 0x78) = (long)(int)out_data._4_4_;
    av1_ctx._4_4_ = mpp_av1_split_fragment((AV1Context *)pts,(Av1UnitFragment *)(pts + 0x70),1);
    ctx_local._4_4_ = av1_ctx._4_4_;
    if ((MPP_NOK < av1_ctx._4_4_) &&
       (av1_ctx._4_4_ =
             mpp_av1_read_fragment_content((AV1Context *)pts,(Av1UnitFragment *)(pts + 0x70)),
       ctx_local._4_4_ = av1_ctx._4_4_, MPP_NOK < av1_ctx._4_4_)) {
      if (*(long *)(pts + 0x58) != 0) {
        av1_ctx._4_4_ =
             mpp_av1_set_context_with_sequence
                       ((Av1CodecContext *)s,*(AV1RawSequenceHeader **)(pts + 0x58));
      }
      mpp_packet_set_pos(task_local,pRStack_60 + (int)out_data._4_4_);
      mpp_av1_fragment_reset((Av1UnitFragment *)(pts + 0x70));
      ctx_local._4_4_ = av1_ctx._4_4_;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

MPP_RET av1d_prepare(void *ctx, MppPacket pkt, HalDecTask *task)
{
    MPP_RET ret = MPP_OK;
    Av1CodecContext *av1_ctx = (Av1CodecContext *)ctx;
    AV1Context *s = (AV1Context *)av1_ctx->priv_data;
    RK_S64 pts = -1;
    RK_S64 dts = -1;
    RK_U8 *buf = NULL;
    RK_S32 length = 0;
    RK_U8 *out_data = NULL;
    RK_S32 out_size = -1;
    RK_S32 consumed = 0;
    RK_U8 *pos = NULL;
    RK_U32 need_split = s->cfg->base.split_parse;

    need_split = 1;
    task->valid = 0;
    av1_ctx->new_frame = 0;

    pts = mpp_packet_get_pts(pkt);
    dts = mpp_packet_get_dts(pkt);
    buf = pos = mpp_packet_get_pos(pkt);
    length = (RK_S32)mpp_packet_get_length(pkt);
    if (mpp_packet_get_flag(pkt)& MPP_PACKET_FLAG_EXTRA_DATA) {
        s->extra_has_frame = 0;
        task = NULL;
        s->current_obu.data = buf;
        s->current_obu.data_size = length;
        ret = mpp_av1_split_fragment(s, &s->current_obu, 1);
        if (ret < 0) {
            return ret;
        }
        ret = mpp_av1_read_fragment_content(s, &s->current_obu);
        if (ret < 0) {
            return ret;
        }
        if (!s->sequence_header) {
            goto end;
        }
        ret = mpp_av1_set_context_with_sequence(av1_ctx, s->sequence_header);
    end:
        pos = buf + length;
        mpp_packet_set_pos(pkt, pos);
        mpp_av1_fragment_reset(&s->current_obu);
        return ret;
    }

    if (need_split) {
        consumed = av1d_split_frame(av1_ctx, &out_data, &out_size, buf, length);
    } else {
        out_size = consumed = length;
        av1_ctx->new_frame = 1;
    }

    pos += (consumed >= 0) ? consumed : length;

    mpp_packet_set_pos(pkt, pos);
    mpp_packet_set_length(pkt, length - consumed);
    if (!mpp_packet_get_length(pkt))
        av1_ctx->eos = mpp_packet_get_eos(pkt);
    av1d_dbg(AV1D_DBG_STRMIN, "pkt_len=%d, pts=%lld , out_size %d consumed %d new frame %d eos %d\n",
             length, pts, out_size, consumed, av1_ctx->new_frame, av1_ctx->eos);
    if (out_size > 0) {
        av1d_get_frame_stream(av1_ctx, buf, consumed);
        task->input_packet = av1_ctx->pkt;
        mpp_packet_set_pts(av1_ctx->pkt, pts);
        mpp_packet_set_dts(av1_ctx->pkt, dts);
    } else {
        task->valid = 0;
        if (av1_ctx->eos)
            task->input_packet = av1_ctx->pkt;
    }
    if (av1_ctx->eos && !mpp_packet_get_length(pkt))
        task->flags.eos = av1_ctx->eos;

    if (av1_ctx->new_frame || (task->flags.eos)) {
        if (av1_ctx->stream_offset > 0)
            task->valid = 1;
        av1_ctx->stream_offset = 0;
    }

    (void)pts;
    (void)dts;
    (void)task;
    return ret = MPP_OK;
}